

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

GCproto * fs_finish(LexState *ls,BCLine line)

{
  uint8_t *puVar1;
  SBuf *sb;
  long lVar2;
  uint *puVar3;
  uint uVar4;
  BCPos BVar5;
  FuncState *fs;
  lua_State *L;
  VarInfo *pVVar6;
  GCtab *pGVar7;
  TValue *pTVar8;
  uint uVar9;
  BCPos BVar10;
  uint uVar11;
  long lVar12;
  GCobj *o;
  ptrdiff_t argbase;
  byte bVar13;
  byte bVar14;
  uint32_t uVar15;
  BCInsLine *pBVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  GCSize size;
  uint uVar23;
  ulong uVar24;
  ushort uVar25;
  MSize MVar26;
  ulong uVar27;
  void *pvVar28;
  uint32_t uVar29;
  char *pcVar30;
  GCobj *v;
  long lVar31;
  ulong uVar32;
  VarInfo *pVVar33;
  uint32_t local_78;
  
  fs = ls->fs;
  uVar23 = line - fs->linedefined;
  L = ls->L;
  uVar4 = fs->pc;
  if (((uVar4 <= fs->lasttarget) || (uVar9 = (byte)fs->bcbase[uVar4 - 1].ins - 0x43, 9 < uVar9)) ||
     ((0x3c3U >> (uVar9 & 0x1f) & 1) == 0)) {
    if ((fs->bl->flags & 8) != 0) {
      bcemit_INS(fs,0x80000032);
    }
    bcemit_INS(fs,0x1004b);
  }
  puVar1 = &fs->bl->flags;
  *puVar1 = *puVar1 | 0x10;
  fscope_end(fs);
  if ((1 < uVar4) && ((fs->flags & 0x40) != 0)) {
    pBVar16 = fs->bcbase;
    iVar21 = 0x7ffe;
    lVar31 = 0;
    do {
      uVar9 = (pBVar16[lVar31 + 1].ins & 0xff) - 0x33;
      if (uVar9 < 0x1a) {
        if ((0x3c30000U >> (uVar9 & 0x1f) & 1) == 0) {
          if (uVar9 == 0) break;
        }
        else {
          BVar10 = bcemit_INS(fs,pBVar16[lVar31 + 1].ins);
          pBVar16 = fs->bcbase;
          pBVar16[BVar10].line = pBVar16[lVar31 + 1].line;
          if (0xffff < BVar10 + iVar21) {
            err_syntax(fs->ls,LJ_ERR_XFIXUP);
          }
          pBVar16[lVar31 + 1].ins = (BVar10 + iVar21) * 0x10000 | 0x32;
        }
      }
      lVar31 = lVar31 + 1;
      iVar21 = iVar21 + -1;
    } while ((ulong)uVar4 - 1 != lVar31);
  }
  uVar4 = fs->pc;
  uVar9 = fs->nkn;
  uVar27 = ((ulong)fs->nkgc + (ulong)uVar4) * 4 + 0x47 & 0xfffffffffffffff8;
  bVar14 = fs->nuv;
  uVar17 = (ulong)((uint)bVar14 * 2 + 2 & 0xfffffffc);
  bVar13 = 2 - (uVar23 < 0x10000);
  lVar31 = uVar27 + (ulong)uVar9 * 8;
  if ((int)uVar23 < 0x100) {
    bVar13 = 0;
  }
  sb = &ls->sb;
  pVVar6 = ls->vstack;
  uVar29 = (ls->sb).b.ptr32;
  (ls->sb).p.ptr32 = uVar29;
  local_78 = uVar29;
  if (bVar14 != 0) {
    uVar32 = 0;
    do {
      uVar24 = (ulong)pVVar6[fs->uvmap[uVar32]].name.gcptr32;
      uVar22 = *(int *)(uVar24 + 0xc) + 1;
      if ((ls->sb).e.ptr32 - uVar29 < uVar22) {
        pcVar30 = lj_buf_more2(sb,uVar22);
      }
      else {
        pcVar30 = (char *)(ulong)uVar29;
      }
      memcpy(pcVar30,(void *)(uVar24 + 0x10),(ulong)uVar22);
      uVar29 = (int)pcVar30 + uVar22;
      (sb->p).ptr32 = uVar29;
      uVar32 = uVar32 + 1;
    } while (bVar14 != uVar32);
    local_78 = (ls->sb).b.ptr32;
  }
  lVar12 = uVar17 + lVar31;
  uVar22 = ls->vtop;
  uVar11 = uVar29;
  if (fs->vbase < uVar22) {
    pVVar33 = pVVar6 + fs->vbase;
    BVar10 = 0;
    pcVar30 = (char *)(ulong)uVar29;
    do {
      if ((pVVar33->info & 6) == 0) {
        uVar11 = (pVVar33->name).gcptr32;
        uVar32 = (ulong)uVar11;
        if (uVar32 < 7) {
          if ((ls->sb).e.ptr32 - (int)pcVar30 < 0xb) {
            pcVar30 = lj_buf_more2(sb,0xb);
          }
          else {
            pcVar30 = (char *)((ulong)pcVar30 & 0xffffffff);
          }
          *pcVar30 = (char)uVar11;
          pcVar30 = pcVar30 + 1;
        }
        else {
          iVar21 = *(int *)(uVar32 + 0xc);
          MVar26 = iVar21 + 0xb;
          if ((ls->sb).e.ptr32 - (int)pcVar30 < MVar26) {
            pcVar30 = lj_buf_more2(sb,MVar26);
          }
          else {
            pcVar30 = (char *)((ulong)pcVar30 & 0xffffffff);
          }
          uVar24 = (ulong)(iVar21 + 1);
          memcpy(pcVar30,(void *)(uVar32 + 0x10),uVar24);
          pcVar30 = pcVar30 + uVar24;
        }
        BVar5 = pVVar33->startpc;
        pcVar30 = lj_strfmt_wuleb128(pcVar30,BVar5 - BVar10);
        pcVar30 = lj_strfmt_wuleb128(pcVar30,pVVar33->endpc - BVar5);
        (sb->p).ptr32 = (uint32_t)pcVar30;
        BVar10 = BVar5;
      }
      uVar11 = (uint)pcVar30;
      pVVar33 = pVVar33 + 1;
    } while (pVVar33 < pVVar6 + uVar22);
  }
  lVar20 = (ulong)(uVar4 - 1 << (bVar13 & 0x1f)) + lVar12;
  if ((ls->sb).e.ptr32 == uVar11) {
    pcVar30 = lj_buf_more2(sb,1);
  }
  else {
    pcVar30 = (char *)(ulong)uVar11;
  }
  uVar15 = (int)pcVar30 + 1;
  *pcVar30 = '\0';
  (ls->sb).p.ptr32 = uVar15;
  size = (int)lVar20 + (uVar15 - (ls->sb).b.ptr32);
  o = (GCobj *)lj_mem_newgco(L,size);
  (o->gch).gct = '\a';
  (o->pt).sizept = size;
  (o->pt).trace = 0;
  bVar14 = fs->flags;
  (o->pt).flags = bVar14 & 0x9f;
  (o->gch).unused1 = fs->numparams;
  bVar13 = fs->framesize;
  (o->gch).unused2 = bVar13;
  (o->th).openupval.gcptr32 = *(uint32_t *)&ls->chunkname;
  lVar2 = (long)o + uVar27;
  *(undefined4 *)(lVar2 + (ulong)(fs->nkgc + 1) * -4) = 0;
  uVar4 = fs->pc;
  bVar14 = (bVar14 & 2) >> 1;
  pBVar16 = fs->bcbase;
  (o->str).hash = uVar4;
  o[1].gch.nextgc.gcptr32 = (uint)bVar14 + (uint)bVar14 * 2 + (uint)bVar13 * 0x100 + 0x59;
  if (1 < (ulong)uVar4) {
    lVar18 = 0;
    do {
      *(BCIns *)((long)o + lVar18 * 4 + 0x44) = pBVar16[lVar18 + 1].ins;
      lVar18 = lVar18 + 1;
    } while ((ulong)uVar4 - 1 != lVar18);
  }
  uVar4 = fs->nkn;
  if ((uVar4 < 0x10001) && (uVar22 = fs->nkgc, uVar22 < 0x10001)) {
    (o->gch).metatable.gcptr32 = (uint32_t)lVar2;
    (o->pt).sizekn = uVar4;
    (o->pt).sizekgc = uVar22;
    pGVar7 = fs->kt;
    uVar32 = (ulong)pGVar7->asize;
    if (pGVar7->asize != 0) {
      uVar24 = (ulong)(pGVar7->array).ptr32;
      uVar19 = 0;
      do {
        if (*(int *)(uVar24 + 4 + uVar19 * 8) == 0) {
          *(double *)(lVar2 + (ulong)*(uint *)(uVar24 + uVar19 * 8) * 8) =
               (double)(uVar19 & 0xffffffff);
          uVar32 = (ulong)pGVar7->asize;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar32);
    }
    lVar18 = (ulong)uVar9 * 8;
    uVar32 = (ulong)(pGVar7->node).ptr32;
    uVar4 = pGVar7->hmask;
    uVar24 = 0;
    do {
      if (*(int *)(uVar32 + 4 + uVar24 * 0x18) == 0) {
        puVar3 = (uint *)(uVar32 + uVar24 * 0x18);
        if (puVar3[3] < 0xfffeffff) {
          *(undefined8 *)(lVar2 + (ulong)*puVar3 * 8) = *(undefined8 *)(puVar3 + 2);
        }
        else {
          v = (GCobj *)(ulong)puVar3[2];
          *(uint *)(lVar2 + ~(ulong)*puVar3 * 4) = puVar3[2];
          if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
            lj_gc_barrierf((global_State *)(ulong)(fs->L->glref).ptr32,o,v);
          }
          if ((puVar3[3] == 0xfffffff8) && (bVar14 = (v->pt).sizeuv, (ulong)bVar14 != 0)) {
            uVar9 = (v->uv).dhash;
            pVVar6 = fs->ls->vstack;
            uVar19 = 0;
            do {
              uVar25 = *(ushort *)((ulong)uVar9 + uVar19 * 2);
              if (uVar25 < 0xffc4) {
                bVar13 = pVVar6[uVar25].slot;
                if ((pVVar6[uVar25].info & 1) == 0) {
                  uVar25 = bVar13 | 0xc000;
                }
                else {
                  uVar25 = bVar13 | 0x8000;
                }
              }
              else {
                uVar25 = uVar25 + 0x3c;
              }
              *(ushort *)((ulong)uVar9 + uVar19 * 2) = uVar25;
              uVar19 = uVar19 + 1;
            } while (bVar14 != uVar19);
          }
        }
      }
      uVar9 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar9;
    } while (uVar9 <= uVar4);
    pvVar28 = (void *)(lVar31 + (long)o);
    (o->uv).dhash = (uint32_t)pvVar28;
    bVar14 = fs->nuv;
    (o->pt).sizeuv = bVar14;
    memcpy(pvVar28,fs->uvtmp,(ulong)((uint)bVar14 * 2));
    iVar21 = fs->linedefined;
    uVar32 = (ulong)((fs->pc - 1) + (uint)(fs->pc == 1));
    pBVar16 = fs->bcbase;
    (o->pt).firstline = iVar21;
    (o->pt).numline = uVar23;
    (o->pt).lineinfo.ptr32 = (int)lVar12 + (uint32_t)o;
    if ((int)uVar23 < 0x100) {
      uVar24 = 0;
      do {
        *(char *)((long)o + uVar24 + uVar27 + lVar18 + uVar17) =
             (char)pBVar16[uVar24 + 1].line - (char)iVar21;
        uVar24 = uVar24 + 1;
      } while (uVar32 != uVar24);
    }
    else if (uVar23 < 0x10000) {
      uVar24 = 0;
      do {
        *(short *)((long)o + uVar24 * 2 + uVar27 + lVar18 + uVar17) =
             (short)pBVar16[uVar24 + 1].line - (short)iVar21;
        uVar24 = uVar24 + 1;
      } while (uVar32 != uVar24);
    }
    else {
      uVar24 = 0;
      do {
        *(BCLine *)((long)o + uVar24 * 4 + uVar27 + lVar18 + uVar17) =
             pBVar16[uVar24 + 1].line - iVar21;
        uVar24 = uVar24 + 1;
      } while (uVar32 != uVar24);
    }
    pvVar28 = (void *)((long)o + lVar20);
    uVar15 = (ls->sb).p.ptr32;
    uVar4 = (ls->sb).b.ptr32;
    MVar26 = (MSize)pvVar28;
    (o->th).stacksize = MVar26;
    (o->pt).varinfo.ptr32 = (uVar29 - local_78) + MVar26;
    memcpy(pvVar28,(void *)(ulong)uVar4,(ulong)(uVar15 - uVar4));
    if (((*(byte *)((ulong)(L->glref).ptr32 + 0x10b) & 1) != 0) &&
       (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_BC), argbase != 0)) {
      pTVar8 = L->top;
      L->top = pTVar8 + 1;
      (pTVar8->u32).lo = (uint32_t)o;
      (pTVar8->field_2).it = 0xfffffff8;
      lj_vmevent_call(L,argbase);
    }
    lj_memprof_add_proto(&o->pt);
    lj_sysprof_add_proto(&o->pt);
    L->top = L->top + -1;
    ls->vtop = fs->vbase;
    ls->fs = fs->prev;
    return (GCproto *)o;
  }
  err_limit(fs,0x10000,"constants");
}

Assistant:

static GCproto *fs_finish(LexState *ls, BCLine line)
{
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  BCLine numline = line - fs->linedefined;
  size_t sizept, ofsk, ofsuv, ofsli, ofsdbg, ofsvar;
  GCproto *pt;

  /* Apply final fixups. */
  fs_fixup_ret(fs);

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = sizeof(GCproto) + fs->pc*sizeof(BCIns) + fs->nkgc*sizeof(GCRef);
  sizept = (sizept + sizeof(TValue)-1) & ~(sizeof(TValue)-1);
  ofsk = sizept; sizept += fs->nkn*sizeof(TValue);
  ofsuv = sizept; sizept += ((fs->nuv+1)&~1)*2;
  ofsli = sizept; sizept += fs_prep_line(fs, numline);
  ofsdbg = sizept; sizept += fs_prep_var(ls, fs, &ofsvar);

  /* Allocate prototype and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->sizept = (MSize)sizept;
  pt->trace = 0;
  pt->flags = (uint8_t)(fs->flags & ~(PROTO_HAS_RETURN|PROTO_FIXUP_RETURN));
  pt->numparams = fs->numparams;
  pt->framesize = fs->framesize;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(fs->nkgc+1)) = 0;
  fs_fixup_bc(fs, pt, (BCIns *)((char *)pt + sizeof(GCproto)), fs->pc);
  fs_fixup_k(fs, pt, (void *)((char *)pt + ofsk));
  fs_fixup_uv1(fs, pt, (uint16_t *)((char *)pt + ofsuv));
  fs_fixup_line(fs, pt, (void *)((char *)pt + ofsli), numline);
  fs_fixup_var(ls, pt, (uint8_t *)((char *)pt + ofsdbg), ofsvar);

  lj_vmevent_send(L, BC,
    setprotoV(L, L->top++, pt);
  );

  /* Add a new prototype to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_proto(pt);
#endif
#if LJ_HASSYSPROF
  lj_sysprof_add_proto(pt);
#endif

  L->top--;  /* Pop table of constants. */
  ls->vtop = fs->vbase;  /* Reset variable stack. */
  ls->fs = fs->prev;
  lj_assertL(ls->fs != NULL || ls->tok == TK_eof, "bad parser state");
  return pt;
}